

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

CSAT_StatusT ABC_Solve(ABC_Manager mng)

{
  int nVars;
  CSAT_Target_ResultT *pCVar1;
  Abc_Obj_t *pNode;
  char *pcVar2;
  int local_28;
  int local_24;
  int i;
  int RetValue;
  Prove_Params_t *pParams;
  ABC_Manager mng_local;
  
  if (mng->pTarget == (Abc_Ntk_t *)0x0) {
    printf("ABC_Solve: Target network is not derived by ABC_SolveInit().\n");
    mng_local._4_4_ = UNDETERMINED;
  }
  else {
    if (mng->mode == 0) {
      local_24 = Abc_NtkIvyProve(&mng->pTarget,&mng->Params);
    }
    else {
      local_24 = Abc_NtkMiterSat(mng->pTarget,(long)(mng->Params).nMiteringLimitLast,0,0,
                                 (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    }
    nVars = Abc_NtkCiNum(mng->pTarget);
    pCVar1 = ABC_TargetResAlloc(nVars);
    mng->pResult = pCVar1;
    if (local_24 == -1) {
      mng->pResult->status = UNDETERMINED;
    }
    else if (local_24 == 1) {
      mng->pResult->status = UNSATISFIABLE;
    }
    else {
      if (local_24 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                      ,0x284,"enum CSAT_StatusT ABC_Solve(ABC_Manager)");
      }
      mng->pResult->status = SATISFIABLE;
      for (local_28 = 0; local_28 < mng->pResult->no_sig; local_28 = local_28 + 1) {
        pNode = Abc_NtkCi(mng->pNtk,local_28);
        pcVar2 = ABC_GetNodeName(mng,pNode);
        pcVar2 = Extra_UtilStrsav(pcVar2);
        mng->pResult->names[local_28] = pcVar2;
        mng->pResult->values[local_28] = mng->pTarget->pModel[local_28];
      }
      if (mng->pTarget->pModel != (int *)0x0) {
        free(mng->pTarget->pModel);
        mng->pTarget->pModel = (int *)0x0;
      }
    }
    Abc_NtkDelete(mng->pTarget);
    mng->pTarget = (Abc_Ntk_t *)0x0;
    mng_local._4_4_ = mng->pResult->status;
  }
  return mng_local._4_4_;
}

Assistant:

enum CSAT_StatusT ABC_Solve( ABC_Manager mng )
{
    Prove_Params_t * pParams = &mng->Params;
    int RetValue, i;

    // check if the target network is available
    if ( mng->pTarget == NULL )
        { printf( "ABC_Solve: Target network is not derived by ABC_SolveInit().\n" ); return UNDETERMINED; }

    // try to prove the miter using a number of techniques
    if ( mng->mode )
        RetValue = Abc_NtkMiterSat( mng->pTarget, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
    else
//        RetValue = Abc_NtkMiterProve( &mng->pTarget, pParams ); // old CEC engine
        RetValue = Abc_NtkIvyProve( &mng->pTarget, pParams ); // new CEC engine

    // analyze the result
    mng->pResult = ABC_TargetResAlloc( Abc_NtkCiNum(mng->pTarget) );
    if ( RetValue == -1 )
        mng->pResult->status = UNDETERMINED;
    else if ( RetValue == 1 )
        mng->pResult->status = UNSATISFIABLE;
    else if ( RetValue == 0 )
    {
        mng->pResult->status = SATISFIABLE;
        // create the array of PI names and values
        for ( i = 0; i < mng->pResult->no_sig; i++ )
        {
            mng->pResult->names[i]  = Extra_UtilStrsav( ABC_GetNodeName(mng, Abc_NtkCi(mng->pNtk, i)) ); 
            mng->pResult->values[i] = mng->pTarget->pModel[i];
        }
        ABC_FREE( mng->pTarget->pModel );
    }
    else assert( 0 );

    // delete the target
    Abc_NtkDelete( mng->pTarget );
    mng->pTarget = NULL;
    // return the status
    return mng->pResult->status;
}